

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall cnn::MomentumSGDTrainer::update(MomentumSGDTrainer *this,real scale)

{
  real rVar1;
  Model *pMVar2;
  pointer ppPVar3;
  Parameters *this_00;
  pointer pSVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  pointer ppLVar8;
  LookupParameters *this_01;
  pointer pSVar9;
  pointer pTVar10;
  pointer pTVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  undefined8 uVar15;
  byte bVar16;
  byte bVar17;
  Index size_1;
  _Hash_node_base *p_Var18;
  pointer ppLVar19;
  char *__function;
  Index index_3;
  ulong uVar20;
  ulong uVar21;
  Index index_7;
  uint uVar22;
  Index size;
  long lVar23;
  uint uVar24;
  Index index_2;
  Index index;
  Index index_5;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  Index index_4;
  ulong uVar28;
  Index index_1;
  ulong uVar29;
  Index size_2;
  pointer ppPVar30;
  ushort uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  float fVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar65 [16];
  ulong local_90;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_68;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_48;
  
  if (this->velocity_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68,
               (this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_48);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68);
    AllocateShadowLookupParameters(&local_68,(this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_48);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_68);
    this->velocity_allocated = true;
  }
  fVar61 = Trainer::clip_gradients(&this->super_Trainer);
  pMVar2 = (this->super_Trainer).model;
  ppPVar30 = (pMVar2->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppPVar3 = (pMVar2->params).
            super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppPVar30 != ppPVar3) {
    uVar27 = 0;
    auVar34 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_00 = *ppPVar30;
      uVar26 = (ulong)(this_00->values).d.nd;
      iVar63 = 1;
      iVar62 = 1;
      if (uVar26 != 0) {
        auVar37 = vpbroadcastq_avx512f();
        uVar20 = 0;
        auVar38 = vmovdqa64_avx512f(auVar34);
        do {
          auVar39 = vmovdqa64_avx512f(auVar38);
          auVar38 = vpbroadcastq_avx512f();
          auVar40 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar16 = (byte)uVar15;
          uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
          bVar17 = (byte)uVar15;
          uVar31 = CONCAT11(bVar17,bVar16);
          auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar20));
          auVar40._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
          auVar40._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
          auVar40._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
          auVar40._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
          auVar40._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
          auVar40._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
          auVar40._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
          auVar40._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
          auVar40._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
          auVar40._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
          auVar40._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
          auVar40._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
          auVar40._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
          auVar40._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
          auVar40._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
          auVar40._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
          auVar38 = vpmulld_avx512f(auVar40,auVar39);
          uVar20 = uVar20 + 0x10;
        } while ((uVar26 + 0xf & 0x1fffffff0) != uVar20);
        auVar37 = vmovdqa32_avx512f(auVar38);
        auVar38._0_4_ =
             (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
        bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
        bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
        bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
        bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
        auVar38._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
        bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
        auVar38._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
        bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
        auVar38._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
        bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
        auVar38._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
        auVar38._32_4_ =
             (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
        bVar13 = (bool)(bVar17 >> 1 & 1);
        auVar38._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
        bVar13 = (bool)(bVar17 >> 2 & 1);
        auVar38._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
        bVar13 = (bool)(bVar17 >> 3 & 1);
        auVar38._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
        bVar13 = (bool)(bVar17 >> 4 & 1);
        auVar38._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
        bVar13 = (bool)(bVar17 >> 5 & 1);
        auVar38._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
        bVar13 = (bool)(bVar17 >> 6 & 1);
        auVar38._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
        auVar38._60_4_ =
             (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
        auVar33 = vextracti64x4_avx512f(auVar38,1);
        auVar37 = vpmulld_avx512f(auVar38,ZEXT3264(auVar33));
        auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar32 = vpshufd_avx(auVar65,0xee);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        auVar32 = vpshufd_avx(auVar65,0x55);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        iVar62 = auVar65._0_4_;
      }
      pSVar4 = (this->vp).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar26 = (ulong)pSVar4[uVar27].h.d.nd;
      if (uVar26 != 0) {
        auVar37 = vpbroadcastq_avx512f();
        uVar20 = 0;
        auVar38 = vmovdqa64_avx512f(auVar34);
        do {
          auVar39 = vmovdqa64_avx512f(auVar38);
          auVar38 = vpbroadcastq_avx512f();
          auVar40 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar16 = (byte)uVar15;
          uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
          bVar17 = (byte)uVar15;
          uVar31 = CONCAT11(bVar17,bVar16);
          auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar4[uVar27].h.d.d + uVar20 * 4));
          auVar41._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
          auVar41._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
          auVar41._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
          auVar41._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
          auVar41._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
          auVar41._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
          auVar41._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
          auVar41._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
          auVar41._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
          auVar41._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
          auVar41._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
          auVar41._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
          auVar41._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
          auVar41._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
          auVar41._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
          auVar41._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
          auVar38 = vpmulld_avx512f(auVar41,auVar39);
          uVar20 = uVar20 + 0x10;
        } while ((uVar26 + 0xf & 0x1fffffff0) != uVar20);
        auVar37 = vmovdqa32_avx512f(auVar38);
        auVar42._0_4_ =
             (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
        bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
        bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
        bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
        bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
        auVar42._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
        bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
        auVar42._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
        bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
        auVar42._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
        bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
        auVar42._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
        auVar42._32_4_ =
             (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
        bVar13 = (bool)(bVar17 >> 1 & 1);
        auVar42._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
        bVar13 = (bool)(bVar17 >> 2 & 1);
        auVar42._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
        bVar13 = (bool)(bVar17 >> 3 & 1);
        auVar42._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
        bVar13 = (bool)(bVar17 >> 4 & 1);
        auVar42._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
        bVar13 = (bool)(bVar17 >> 5 & 1);
        auVar42._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
        bVar13 = (bool)(bVar17 >> 6 & 1);
        auVar42._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
        auVar42._60_4_ =
             (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
        auVar33 = vextracti64x4_avx512f(auVar42,1);
        auVar37 = vpmulld_avx512f(auVar42,ZEXT3264(auVar33));
        auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar32 = vpshufd_avx(auVar65,0xee);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        auVar32 = vpshufd_avx(auVar65,0x55);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        iVar63 = auVar65._0_4_;
      }
      uVar20 = (ulong)(this_00->g).d.nd;
      if (uVar20 == 0) {
        iVar64 = 1;
      }
      else {
        auVar37 = vpbroadcastq_avx512f();
        uVar25 = 0;
        auVar38 = vmovdqa64_avx512f(auVar34);
        do {
          auVar39 = vmovdqa64_avx512f(auVar38);
          auVar38 = vpbroadcastq_avx512f();
          auVar40 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar16 = (byte)uVar15;
          uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
          bVar17 = (byte)uVar15;
          uVar31 = CONCAT11(bVar17,bVar16);
          auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar25));
          auVar43._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
          auVar43._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
          auVar43._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
          auVar43._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
          auVar43._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
          auVar43._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
          auVar43._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
          auVar43._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
          auVar43._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
          auVar43._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
          auVar43._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
          auVar43._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
          auVar43._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
          auVar43._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
          auVar43._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
          auVar43._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
          auVar38 = vpmulld_avx512f(auVar43,auVar39);
          uVar25 = uVar25 + 0x10;
        } while ((uVar20 + 0xf & 0x1fffffff0) != uVar25);
        auVar37 = vmovdqa32_avx512f(auVar38);
        auVar44._0_4_ =
             (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
        bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
        bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
        bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
        bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
        bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
        bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
        bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
        auVar44._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
        auVar44._32_4_ =
             (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
        bVar13 = (bool)(bVar17 >> 1 & 1);
        auVar44._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
        bVar13 = (bool)(bVar17 >> 2 & 1);
        auVar44._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
        bVar13 = (bool)(bVar17 >> 3 & 1);
        auVar44._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
        bVar13 = (bool)(bVar17 >> 4 & 1);
        auVar44._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
        bVar13 = (bool)(bVar17 >> 5 & 1);
        auVar44._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
        bVar13 = (bool)(bVar17 >> 6 & 1);
        auVar44._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
        auVar44._60_4_ =
             (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
        auVar33 = vextracti64x4_avx512f(auVar44,1);
        auVar37 = vpmulld_avx512f(auVar44,ZEXT3264(auVar33));
        auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar32 = vpshufd_avx(auVar65,0xee);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        auVar32 = vpshufd_avx(auVar65,0x55);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        iVar64 = auVar65._0_4_;
      }
      uVar22 = pSVar4[uVar27].h.d.bd;
      uVar24 = iVar64 * (this_00->g).d.bd;
      if (iVar63 * uVar22 != uVar24) goto LAB_0022a727;
      if (uVar26 == 0) {
        iVar63 = 1;
      }
      else {
        auVar37 = vpbroadcastq_avx512f();
        uVar20 = 0;
        auVar38 = vmovdqa64_avx512f(auVar34);
        do {
          auVar39 = vmovdqa64_avx512f(auVar38);
          auVar38 = vpbroadcastq_avx512f();
          auVar40 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar16 = (byte)uVar15;
          uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
          bVar17 = (byte)uVar15;
          uVar31 = CONCAT11(bVar17,bVar16);
          auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar4[uVar27].h.d.d + uVar20 * 4));
          auVar45._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
          auVar45._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
          auVar45._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
          auVar45._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
          auVar45._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
          auVar45._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
          auVar45._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
          auVar45._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
          auVar45._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
          auVar45._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
          auVar45._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
          auVar45._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
          auVar45._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
          auVar45._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
          auVar45._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
          auVar45._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
          auVar38 = vpmulld_avx512f(auVar45,auVar39);
          uVar20 = uVar20 + 0x10;
        } while ((uVar26 + 0xf & 0x1fffffff0) != uVar20);
        auVar37 = vmovdqa32_avx512f(auVar38);
        auVar46._0_4_ =
             (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
        bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
        bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
        bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
        bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
        bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
        bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
        bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
        auVar46._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
        auVar46._32_4_ =
             (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
        bVar13 = (bool)(bVar17 >> 1 & 1);
        auVar46._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
        bVar13 = (bool)(bVar17 >> 2 & 1);
        auVar46._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
        bVar13 = (bool)(bVar17 >> 3 & 1);
        auVar46._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
        bVar13 = (bool)(bVar17 >> 4 & 1);
        auVar46._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
        bVar13 = (bool)(bVar17 >> 5 & 1);
        auVar46._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
        bVar13 = (bool)(bVar17 >> 6 & 1);
        auVar46._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
        auVar46._60_4_ =
             (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
        auVar33 = vextracti64x4_avx512f(auVar46,1);
        auVar37 = vpmulld_avx512f(auVar46,ZEXT3264(auVar33));
        auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar32 = vpshufd_avx(auVar65,0xee);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        auVar32 = vpshufd_avx(auVar65,0x55);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        iVar63 = auVar65._0_4_;
      }
      uVar22 = iVar63 * uVar22;
      uVar26 = (ulong)uVar22;
      if (uVar22 != uVar24) {
LAB_0022a705:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                     );
      }
      pfVar5 = pSVar4[uVar27].h.v;
      uVar20 = uVar26;
      if ((((ulong)pfVar5 & 3) == 0) &&
         (uVar20 = (ulong)(-((uint)((ulong)pfVar5 >> 2) & 0x3fffffff) & 0xf), uVar26 <= uVar20)) {
        uVar20 = uVar26;
      }
      pfVar6 = (this_00->values).v;
      uVar22 = iVar62 * (this_00->values).d.bd;
      rVar1 = (this->super_Trainer).lambda;
      fVar14 = fVar61 * scale * (this->super_Trainer).eta;
      pfVar7 = (this_00->g).v;
      uVar21 = uVar26 - uVar20;
      uVar25 = uVar21 + 0xf;
      if (-1 < (long)uVar21) {
        uVar25 = uVar21;
      }
      auVar65 = ZEXT416((uint)this->momentum);
      if (uVar20 != 0) {
        uVar28 = 0;
        do {
          auVar32 = vfmsub231ss_fma(ZEXT416((uint)(fVar14 * pfVar7[uVar28])),auVar65,
                                    ZEXT416((uint)pfVar5[uVar28]));
          pfVar5[uVar28] = auVar32._0_4_;
          uVar28 = uVar28 + 1;
        } while (uVar20 != uVar28);
      }
      uVar25 = (uVar25 & 0xfffffffffffffff0) + uVar20;
      if (0xf < (long)uVar21) {
        auVar37 = vbroadcastss_avx512f(auVar65);
        auVar38 = vbroadcastss_avx512f(ZEXT416((uint)fVar14));
        do {
          auVar39 = vmulps_avx512f(auVar38,*(undefined1 (*) [64])(pfVar7 + uVar20));
          auVar39 = vfmsub231ps_avx512f(auVar39,auVar37,*(undefined1 (*) [64])(pfVar5 + uVar20));
          *(undefined1 (*) [64])(pfVar5 + uVar20) = auVar39;
          uVar20 = uVar20 + 0x10;
        } while ((long)uVar20 < (long)uVar25);
      }
      if ((long)uVar25 < (long)uVar26) {
        do {
          auVar32 = vfmsub231ss_fma(ZEXT416((uint)(fVar14 * pfVar7[uVar25])),auVar65,
                                    ZEXT416((uint)pfVar5[uVar25]));
          pfVar5[uVar25] = auVar32._0_4_;
          uVar25 = uVar25 + 1;
        } while (uVar26 != uVar25);
      }
      pfVar5 = pSVar4[uVar27].h.v;
      uVar26 = (ulong)pSVar4[uVar27].h.d.nd;
      if (uVar26 == 0) {
        iVar62 = 1;
      }
      else {
        auVar37 = vpbroadcastq_avx512f();
        uVar20 = 0;
        auVar38 = vmovdqa64_avx512f(auVar34);
        do {
          auVar39 = vmovdqa64_avx512f(auVar38);
          auVar38 = vpbroadcastq_avx512f();
          auVar40 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar16 = (byte)uVar15;
          uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
          bVar17 = (byte)uVar15;
          uVar31 = CONCAT11(bVar17,bVar16);
          auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar4[uVar27].h.d.d + uVar20 * 4));
          auVar47._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
          auVar47._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
          auVar47._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
          auVar47._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
          auVar47._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
          auVar47._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
          auVar47._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
          auVar47._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
          auVar47._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
          auVar47._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
          auVar47._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
          auVar47._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
          auVar47._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
          auVar47._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
          auVar47._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
          auVar47._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
          auVar38 = vpmulld_avx512f(auVar47,auVar39);
          uVar20 = uVar20 + 0x10;
        } while ((uVar26 + 0xf & 0x1fffffff0) != uVar20);
        auVar37 = vmovdqa32_avx512f(auVar38);
        auVar48._0_4_ =
             (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
        bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
        bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
        bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
        bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
        bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
        bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
        bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
        auVar48._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
        auVar48._32_4_ =
             (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
        bVar13 = (bool)(bVar17 >> 1 & 1);
        auVar48._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
        bVar13 = (bool)(bVar17 >> 2 & 1);
        auVar48._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
        bVar13 = (bool)(bVar17 >> 3 & 1);
        auVar48._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
        bVar13 = (bool)(bVar17 >> 4 & 1);
        auVar48._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
        bVar13 = (bool)(bVar17 >> 5 & 1);
        auVar48._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
        bVar13 = (bool)(bVar17 >> 6 & 1);
        auVar48._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
        auVar48._60_4_ =
             (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
        auVar33 = vextracti64x4_avx512f(auVar48,1);
        auVar37 = vpmulld_avx512f(auVar48,ZEXT3264(auVar33));
        auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar32 = vpshufd_avx(auVar65,0xee);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        auVar32 = vpshufd_avx(auVar65,0x55);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        iVar62 = auVar65._0_4_;
      }
      if (iVar62 * pSVar4[uVar27].h.d.bd != uVar22) goto LAB_0022a73e;
      uVar26 = (ulong)(this_00->values).d.nd;
      if (uVar26 == 0) {
        iVar62 = 1;
      }
      else {
        auVar37 = vpbroadcastq_avx512f();
        uVar20 = 0;
        auVar34 = vmovdqa64_avx512f(auVar34);
        do {
          auVar38 = vmovdqa64_avx512f(auVar34);
          auVar34 = vpbroadcastq_avx512f();
          auVar39 = vporq_avx512f(auVar34,auVar35);
          auVar34 = vporq_avx512f(auVar34,auVar36);
          uVar15 = vpcmpuq_avx512f(auVar34,auVar37,2);
          bVar16 = (byte)uVar15;
          uVar15 = vpcmpuq_avx512f(auVar39,auVar37,2);
          bVar17 = (byte)uVar15;
          uVar31 = CONCAT11(bVar17,bVar16);
          auVar34 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar20));
          auVar39._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar34._4_4_;
          auVar39._0_4_ = (uint)(bVar16 & 1) * auVar34._0_4_;
          auVar39._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar34._8_4_;
          auVar39._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar34._12_4_;
          auVar39._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar34._16_4_;
          auVar39._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar34._20_4_;
          auVar39._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar34._24_4_;
          auVar39._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar34._28_4_;
          auVar39._32_4_ = (uint)(bVar17 & 1) * auVar34._32_4_;
          auVar39._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar34._36_4_;
          auVar39._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar34._40_4_;
          auVar39._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar34._44_4_;
          auVar39._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar34._48_4_;
          auVar39._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar34._52_4_;
          auVar39._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar34._56_4_;
          auVar39._60_4_ = (uint)(bVar17 >> 7) * auVar34._60_4_;
          auVar34 = vpmulld_avx512f(auVar39,auVar38);
          uVar20 = uVar20 + 0x10;
        } while ((uVar26 + 0xf & 0x1fffffff0) != uVar20);
        auVar34 = vmovdqa32_avx512f(auVar34);
        auVar35._0_4_ =
             (uint)(bVar16 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar38._0_4_;
        bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar13 * auVar34._4_4_ | (uint)!bVar13 * auVar38._4_4_;
        bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar13 * auVar34._8_4_ | (uint)!bVar13 * auVar38._8_4_;
        bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar13 * auVar34._12_4_ | (uint)!bVar13 * auVar38._12_4_;
        bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar13 * auVar34._16_4_ | (uint)!bVar13 * auVar38._16_4_;
        bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar13 * auVar34._20_4_ | (uint)!bVar13 * auVar38._20_4_;
        bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar13 * auVar34._24_4_ | (uint)!bVar13 * auVar38._24_4_;
        bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
        auVar35._28_4_ = (uint)bVar13 * auVar34._28_4_ | (uint)!bVar13 * auVar38._28_4_;
        auVar35._32_4_ =
             (uint)(bVar17 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar38._32_4_;
        bVar13 = (bool)(bVar17 >> 1 & 1);
        auVar35._36_4_ = (uint)bVar13 * auVar34._36_4_ | (uint)!bVar13 * auVar38._36_4_;
        bVar13 = (bool)(bVar17 >> 2 & 1);
        auVar35._40_4_ = (uint)bVar13 * auVar34._40_4_ | (uint)!bVar13 * auVar38._40_4_;
        bVar13 = (bool)(bVar17 >> 3 & 1);
        auVar35._44_4_ = (uint)bVar13 * auVar34._44_4_ | (uint)!bVar13 * auVar38._44_4_;
        bVar13 = (bool)(bVar17 >> 4 & 1);
        auVar35._48_4_ = (uint)bVar13 * auVar34._48_4_ | (uint)!bVar13 * auVar38._48_4_;
        bVar13 = (bool)(bVar17 >> 5 & 1);
        auVar35._52_4_ = (uint)bVar13 * auVar34._52_4_ | (uint)!bVar13 * auVar38._52_4_;
        bVar13 = (bool)(bVar17 >> 6 & 1);
        auVar35._56_4_ = (uint)bVar13 * auVar34._56_4_ | (uint)!bVar13 * auVar38._56_4_;
        auVar35._60_4_ =
             (uint)(bVar17 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar38._60_4_;
        auVar33 = vextracti64x4_avx512f(auVar35,1);
        auVar34 = vpmulld_avx512f(auVar35,ZEXT3264(auVar33));
        auVar65 = vpmulld_avx(auVar34._0_16_,auVar34._16_16_);
        auVar32 = vpshufd_avx(auVar65,0xee);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        auVar32 = vpshufd_avx(auVar65,0x55);
        auVar65 = vpmulld_avx(auVar65,auVar32);
        iVar62 = auVar65._0_4_;
      }
      uVar24 = iVar62 * (this_00->values).d.bd;
      uVar26 = (ulong)uVar24;
      if (uVar24 != uVar22) {
LAB_0022a6e3:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      pfVar7 = (this_00->values).v;
      uVar20 = uVar26;
      if ((((ulong)pfVar7 & 3) == 0) &&
         (uVar20 = (ulong)(-((uint)((ulong)pfVar7 >> 2) & 0x3fffffff) & 0xf), uVar26 <= uVar20)) {
        uVar20 = uVar26;
      }
      uVar21 = uVar26 - uVar20;
      uVar25 = uVar21 + 0xf;
      if (-1 < (long)uVar21) {
        uVar25 = uVar21;
      }
      auVar65 = ZEXT416((uint)rVar1);
      if (uVar20 != 0) {
        uVar28 = 0;
        do {
          auVar32 = vfnmadd213ss_fma(ZEXT416((uint)pfVar6[uVar28]),auVar65,
                                     ZEXT416((uint)pfVar5[uVar28]));
          pfVar7[uVar28] = auVar32._0_4_ + pfVar7[uVar28];
          uVar28 = uVar28 + 1;
        } while (uVar20 != uVar28);
      }
      uVar25 = (uVar25 & 0xfffffffffffffff0) + uVar20;
      if (0xf < (long)uVar21) {
        auVar32._8_4_ = 0x80000000;
        auVar32._0_8_ = 0x8000000080000000;
        auVar32._12_4_ = 0x80000000;
        auVar32 = vxorps_avx512vl(auVar65,auVar32);
        auVar34 = vbroadcastss_avx512f(auVar32);
        do {
          auVar35 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar7 + uVar20),
                                   *(undefined1 (*) [64])(pfVar5 + uVar20));
          auVar35 = vfmadd231ps_avx512f(auVar35,auVar34,*(undefined1 (*) [64])(pfVar6 + uVar20));
          *(undefined1 (*) [64])(pfVar7 + uVar20) = auVar35;
          uVar20 = uVar20 + 0x10;
        } while ((long)uVar20 < (long)uVar25);
      }
      if ((long)uVar25 < (long)uVar26) {
        do {
          auVar32 = vfnmadd213ss_fma(ZEXT416((uint)pfVar6[uVar25]),auVar65,
                                     ZEXT416((uint)pfVar5[uVar25]));
          pfVar7[uVar25] = auVar32._0_4_ + pfVar7[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar26 != uVar25);
      }
      uVar27 = (ulong)((int)uVar27 + 1);
      Parameters::clear(this_00);
      ppPVar30 = ppPVar30 + 1;
      auVar34 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (ppPVar30 != ppPVar3);
  }
  pMVar2 = (this->super_Trainer).model;
  ppLVar19 = (pMVar2->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar8 = (pMVar2->lookup_params).
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar19 != ppLVar8) {
    local_90 = 0;
    auVar34 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_01 = *ppLVar19;
      p_Var18 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var18 != (_Hash_node_base *)0x0) {
        pSVar9 = (this->vlp).
                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar27 = (ulong)*(uint *)&p_Var18[1]._M_nxt;
          pTVar10 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar26 = (ulong)pTVar10[uVar27].d.nd;
          iVar63 = 1;
          iVar62 = 1;
          if (uVar26 != 0) {
            auVar37 = vpbroadcastq_avx512f();
            uVar20 = 0;
            auVar38 = vmovdqa64_avx512f(auVar34);
            do {
              auVar39 = vmovdqa64_avx512f(auVar38);
              auVar38 = vpbroadcastq_avx512f();
              auVar40 = vporq_avx512f(auVar38,auVar35);
              auVar38 = vporq_avx512f(auVar38,auVar36);
              uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
              bVar16 = (byte)uVar15;
              uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
              bVar17 = (byte)uVar15;
              uVar31 = CONCAT11(bVar17,bVar16);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar10[uVar27].d.d + uVar20));
              auVar49._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
              auVar49._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
              auVar49._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
              auVar49._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
              auVar49._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
              auVar49._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
              auVar49._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
              auVar49._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
              auVar49._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
              auVar49._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
              auVar49._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
              auVar49._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
              auVar49._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
              auVar49._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
              auVar49._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
              auVar49._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
              auVar38 = vpmulld_avx512f(auVar49,auVar39);
              uVar20 = uVar20 + 0x10;
            } while ((uVar26 + 0xf & 0x1fffffff0) != uVar20);
            auVar37 = vmovdqa32_avx512f(auVar38);
            auVar50._0_4_ =
                 (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
            bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
            bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
            bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar50._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
            bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar50._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
            bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar50._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
            bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar50._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
            bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
            auVar50._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
            auVar50._32_4_ =
                 (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
            bVar13 = (bool)(bVar17 >> 1 & 1);
            auVar50._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
            bVar13 = (bool)(bVar17 >> 2 & 1);
            auVar50._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
            bVar13 = (bool)(bVar17 >> 3 & 1);
            auVar50._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
            bVar13 = (bool)(bVar17 >> 4 & 1);
            auVar50._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
            bVar13 = (bool)(bVar17 >> 5 & 1);
            auVar50._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
            bVar13 = (bool)(bVar17 >> 6 & 1);
            auVar50._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
            auVar50._60_4_ =
                 (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
            auVar33 = vextracti64x4_avx512f(auVar50,1);
            auVar37 = vpmulld_avx512f(auVar50,ZEXT3264(auVar33));
            auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
            auVar32 = vpshufd_avx(auVar65,0xee);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            auVar32 = vpshufd_avx(auVar65,0x55);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            iVar62 = auVar65._0_4_;
          }
          lVar23 = *(long *)&pSVar9[local_90].h.
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                   uVar27 * 0x48;
          uVar26 = (ulong)*(uint *)(lVar23 + 0x1c);
          if (uVar26 != 0) {
            auVar37 = vpbroadcastq_avx512f();
            uVar20 = 0;
            auVar38 = vmovdqa64_avx512f(auVar34);
            do {
              auVar39 = vmovdqa64_avx512f(auVar38);
              auVar38 = vpbroadcastq_avx512f();
              auVar40 = vporq_avx512f(auVar38,auVar35);
              auVar38 = vporq_avx512f(auVar38,auVar36);
              uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
              bVar16 = (byte)uVar15;
              uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
              bVar17 = (byte)uVar15;
              uVar31 = CONCAT11(bVar17,bVar16);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar23 + uVar20 * 4));
              auVar51._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
              auVar51._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
              auVar51._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
              auVar51._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
              auVar51._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
              auVar51._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
              auVar51._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
              auVar51._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
              auVar51._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
              auVar51._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
              auVar51._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
              auVar51._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
              auVar51._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
              auVar51._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
              auVar51._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
              auVar51._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
              auVar38 = vpmulld_avx512f(auVar51,auVar39);
              uVar20 = uVar20 + 0x10;
            } while ((uVar26 + 0xf & 0x1fffffff0) != uVar20);
            auVar37 = vmovdqa32_avx512f(auVar38);
            auVar52._0_4_ =
                 (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
            bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
            bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
            bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar52._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
            bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar52._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
            bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar52._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
            bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar52._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
            bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
            auVar52._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
            auVar52._32_4_ =
                 (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
            bVar13 = (bool)(bVar17 >> 1 & 1);
            auVar52._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
            bVar13 = (bool)(bVar17 >> 2 & 1);
            auVar52._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
            bVar13 = (bool)(bVar17 >> 3 & 1);
            auVar52._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
            bVar13 = (bool)(bVar17 >> 4 & 1);
            auVar52._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
            bVar13 = (bool)(bVar17 >> 5 & 1);
            auVar52._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
            bVar13 = (bool)(bVar17 >> 6 & 1);
            auVar52._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
            auVar52._60_4_ =
                 (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
            auVar33 = vextracti64x4_avx512f(auVar52,1);
            auVar37 = vpmulld_avx512f(auVar52,ZEXT3264(auVar33));
            auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
            auVar32 = vpshufd_avx(auVar65,0xee);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            auVar32 = vpshufd_avx(auVar65,0x55);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            iVar63 = auVar65._0_4_;
          }
          pTVar11 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar20 = (ulong)pTVar11[uVar27].d.nd;
          if (uVar20 == 0) {
            iVar64 = 1;
          }
          else {
            auVar37 = vpbroadcastq_avx512f();
            uVar25 = 0;
            auVar38 = vmovdqa64_avx512f(auVar34);
            do {
              auVar39 = vmovdqa64_avx512f(auVar38);
              auVar38 = vpbroadcastq_avx512f();
              auVar40 = vporq_avx512f(auVar38,auVar35);
              auVar38 = vporq_avx512f(auVar38,auVar36);
              uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
              bVar16 = (byte)uVar15;
              uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
              bVar17 = (byte)uVar15;
              uVar31 = CONCAT11(bVar17,bVar16);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar11[uVar27].d.d + uVar25));
              auVar53._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
              auVar53._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
              auVar53._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
              auVar53._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
              auVar53._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
              auVar53._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
              auVar53._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
              auVar53._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
              auVar53._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
              auVar53._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
              auVar53._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
              auVar53._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
              auVar53._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
              auVar53._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
              auVar53._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
              auVar53._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
              auVar38 = vpmulld_avx512f(auVar53,auVar39);
              uVar25 = uVar25 + 0x10;
            } while ((uVar20 + 0xf & 0x1fffffff0) != uVar25);
            auVar37 = vmovdqa32_avx512f(auVar38);
            auVar54._0_4_ =
                 (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
            bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar54._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
            bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar54._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
            bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar54._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
            bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar54._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
            bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar54._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
            bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar54._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
            bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
            auVar54._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
            auVar54._32_4_ =
                 (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
            bVar13 = (bool)(bVar17 >> 1 & 1);
            auVar54._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
            bVar13 = (bool)(bVar17 >> 2 & 1);
            auVar54._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
            bVar13 = (bool)(bVar17 >> 3 & 1);
            auVar54._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
            bVar13 = (bool)(bVar17 >> 4 & 1);
            auVar54._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
            bVar13 = (bool)(bVar17 >> 5 & 1);
            auVar54._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
            bVar13 = (bool)(bVar17 >> 6 & 1);
            auVar54._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
            auVar54._60_4_ =
                 (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
            auVar33 = vextracti64x4_avx512f(auVar54,1);
            auVar37 = vpmulld_avx512f(auVar54,ZEXT3264(auVar33));
            auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
            auVar32 = vpshufd_avx(auVar65,0xee);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            auVar32 = vpshufd_avx(auVar65,0x55);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            iVar64 = auVar65._0_4_;
          }
          uVar22 = iVar64 * pTVar11[uVar27].d.bd;
          if (iVar63 * *(int *)(lVar23 + 0x20) != uVar22) goto LAB_0022a727;
          if (uVar26 == 0) {
            iVar63 = 1;
          }
          else {
            auVar37 = vpbroadcastq_avx512f();
            uVar20 = 0;
            auVar38 = vmovdqa64_avx512f(auVar34);
            do {
              auVar39 = vmovdqa64_avx512f(auVar38);
              auVar38 = vpbroadcastq_avx512f();
              auVar40 = vporq_avx512f(auVar38,auVar35);
              auVar38 = vporq_avx512f(auVar38,auVar36);
              uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
              bVar16 = (byte)uVar15;
              uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
              bVar17 = (byte)uVar15;
              uVar31 = CONCAT11(bVar17,bVar16);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar23 + uVar20 * 4));
              auVar55._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
              auVar55._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
              auVar55._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
              auVar55._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
              auVar55._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
              auVar55._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
              auVar55._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
              auVar55._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
              auVar55._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
              auVar55._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
              auVar55._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
              auVar55._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
              auVar55._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
              auVar55._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
              auVar55._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
              auVar55._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
              auVar38 = vpmulld_avx512f(auVar55,auVar39);
              uVar20 = uVar20 + 0x10;
            } while ((uVar26 + 0xf & 0x1fffffff0) != uVar20);
            auVar37 = vmovdqa32_avx512f(auVar38);
            auVar56._0_4_ =
                 (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
            bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar56._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
            bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar56._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
            bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar56._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
            bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar56._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
            bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar56._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
            bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar56._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
            bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
            auVar56._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
            auVar56._32_4_ =
                 (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
            bVar13 = (bool)(bVar17 >> 1 & 1);
            auVar56._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
            bVar13 = (bool)(bVar17 >> 2 & 1);
            auVar56._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
            bVar13 = (bool)(bVar17 >> 3 & 1);
            auVar56._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
            bVar13 = (bool)(bVar17 >> 4 & 1);
            auVar56._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
            bVar13 = (bool)(bVar17 >> 5 & 1);
            auVar56._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
            bVar13 = (bool)(bVar17 >> 6 & 1);
            auVar56._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
            auVar56._60_4_ =
                 (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
            auVar33 = vextracti64x4_avx512f(auVar56,1);
            auVar37 = vpmulld_avx512f(auVar56,ZEXT3264(auVar33));
            auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
            auVar32 = vpshufd_avx(auVar65,0xee);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            auVar32 = vpshufd_avx(auVar65,0x55);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            iVar63 = auVar65._0_4_;
          }
          uVar24 = iVar63 * *(int *)(lVar23 + 0x20);
          uVar26 = (ulong)uVar24;
          if (uVar24 != uVar22) goto LAB_0022a705;
          uVar20 = *(ulong *)(lVar23 + 0x28);
          uVar25 = uVar26;
          if (((uVar20 & 3) == 0) &&
             (uVar25 = (ulong)(-((uint)(uVar20 >> 2) & 0x3fffffff) & 0xf), uVar26 <= uVar25)) {
            uVar25 = uVar26;
          }
          pfVar5 = pTVar10[uVar27].v;
          uVar22 = iVar62 * pTVar10[uVar27].d.bd;
          rVar1 = (this->super_Trainer).lambda;
          fVar14 = fVar61 * scale * (this->super_Trainer).eta;
          pfVar6 = pTVar11[uVar27].v;
          uVar28 = uVar26 - uVar25;
          uVar21 = uVar28 + 0xf;
          if (-1 < (long)uVar28) {
            uVar21 = uVar28;
          }
          auVar65 = ZEXT416((uint)this->momentum);
          if (uVar25 != 0) {
            uVar29 = 0;
            do {
              auVar32 = vfmsub231ss_fma(ZEXT416((uint)(fVar14 * pfVar6[uVar29])),auVar65,
                                        ZEXT416(*(uint *)(uVar20 + uVar29 * 4)));
              *(int *)(uVar20 + uVar29 * 4) = auVar32._0_4_;
              uVar29 = uVar29 + 1;
            } while (uVar25 != uVar29);
          }
          uVar21 = (uVar21 & 0xfffffffffffffff0) + uVar25;
          if (0xf < (long)uVar28) {
            auVar37 = vbroadcastss_avx512f(auVar65);
            auVar38 = vbroadcastss_avx512f(ZEXT416((uint)fVar14));
            do {
              auVar39 = vmulps_avx512f(auVar38,*(undefined1 (*) [64])(pfVar6 + uVar25));
              auVar39 = vfmsub231ps_avx512f(auVar39,auVar37,
                                            *(undefined1 (*) [64])(uVar20 + uVar25 * 4));
              *(undefined1 (*) [64])(uVar20 + uVar25 * 4) = auVar39;
              uVar25 = uVar25 + 0x10;
            } while ((long)uVar25 < (long)uVar21);
          }
          if ((long)uVar21 < (long)uVar26) {
            do {
              auVar32 = vfmsub231ss_fma(ZEXT416((uint)(fVar14 * pfVar6[uVar21])),auVar65,
                                        ZEXT416(*(uint *)(uVar20 + uVar21 * 4)));
              *(int *)(uVar20 + uVar21 * 4) = auVar32._0_4_;
              uVar21 = uVar21 + 1;
            } while (uVar26 != uVar21);
          }
          lVar12 = *(long *)(lVar23 + 0x28);
          if ((ulong)*(uint *)(lVar23 + 0x1c) == 0) {
            iVar62 = 1;
          }
          else {
            auVar37 = vpbroadcastq_avx512f();
            uVar26 = 0;
            auVar38 = vmovdqa64_avx512f(auVar34);
            do {
              auVar39 = vmovdqa64_avx512f(auVar38);
              auVar38 = vpbroadcastq_avx512f();
              auVar40 = vporq_avx512f(auVar38,auVar35);
              auVar38 = vporq_avx512f(auVar38,auVar36);
              uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
              bVar16 = (byte)uVar15;
              uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
              bVar17 = (byte)uVar15;
              uVar31 = CONCAT11(bVar17,bVar16);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar23 + uVar26 * 4));
              auVar57._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
              auVar57._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
              auVar57._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
              auVar57._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
              auVar57._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
              auVar57._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
              auVar57._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
              auVar57._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
              auVar57._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
              auVar57._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
              auVar57._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
              auVar57._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
              auVar57._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
              auVar57._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
              auVar57._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
              auVar57._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
              auVar38 = vpmulld_avx512f(auVar57,auVar39);
              uVar26 = uVar26 + 0x10;
            } while (((ulong)*(uint *)(lVar23 + 0x1c) + 0xf & 0x1fffffff0) != uVar26);
            auVar37 = vmovdqa32_avx512f(auVar38);
            auVar58._0_4_ =
                 (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
            bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar58._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
            bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar58._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
            bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar58._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
            bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar58._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
            bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar58._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
            bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar58._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
            bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
            auVar58._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
            auVar58._32_4_ =
                 (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
            bVar13 = (bool)(bVar17 >> 1 & 1);
            auVar58._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
            bVar13 = (bool)(bVar17 >> 2 & 1);
            auVar58._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
            bVar13 = (bool)(bVar17 >> 3 & 1);
            auVar58._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
            bVar13 = (bool)(bVar17 >> 4 & 1);
            auVar58._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
            bVar13 = (bool)(bVar17 >> 5 & 1);
            auVar58._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
            bVar13 = (bool)(bVar17 >> 6 & 1);
            auVar58._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
            auVar58._60_4_ =
                 (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
            auVar33 = vextracti64x4_avx512f(auVar58,1);
            auVar37 = vpmulld_avx512f(auVar58,ZEXT3264(auVar33));
            auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
            auVar32 = vpshufd_avx(auVar65,0xee);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            auVar32 = vpshufd_avx(auVar65,0x55);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            iVar62 = auVar65._0_4_;
          }
          if (iVar62 * *(int *)(lVar23 + 0x20) != uVar22) goto LAB_0022a73e;
          pTVar10 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar26 = (ulong)pTVar10[uVar27].d.nd;
          if (uVar26 == 0) {
            iVar62 = 1;
          }
          else {
            auVar37 = vpbroadcastq_avx512f();
            uVar20 = 0;
            auVar38 = vmovdqa64_avx512f(auVar34);
            do {
              auVar39 = vmovdqa64_avx512f(auVar38);
              auVar38 = vpbroadcastq_avx512f();
              auVar40 = vporq_avx512f(auVar38,auVar35);
              auVar38 = vporq_avx512f(auVar38,auVar36);
              uVar15 = vpcmpuq_avx512f(auVar38,auVar37,2);
              bVar16 = (byte)uVar15;
              uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
              bVar17 = (byte)uVar15;
              uVar31 = CONCAT11(bVar17,bVar16);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar10[uVar27].d.d + uVar20));
              auVar59._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar38._4_4_;
              auVar59._0_4_ = (uint)(bVar16 & 1) * auVar38._0_4_;
              auVar59._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar38._8_4_;
              auVar59._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar38._12_4_;
              auVar59._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * auVar38._16_4_;
              auVar59._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * auVar38._20_4_;
              auVar59._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * auVar38._24_4_;
              auVar59._28_4_ = (uint)((byte)(uVar31 >> 7) & 1) * auVar38._28_4_;
              auVar59._32_4_ = (uint)(bVar17 & 1) * auVar38._32_4_;
              auVar59._36_4_ = (uint)(bVar17 >> 1 & 1) * auVar38._36_4_;
              auVar59._40_4_ = (uint)(bVar17 >> 2 & 1) * auVar38._40_4_;
              auVar59._44_4_ = (uint)(bVar17 >> 3 & 1) * auVar38._44_4_;
              auVar59._48_4_ = (uint)(bVar17 >> 4 & 1) * auVar38._48_4_;
              auVar59._52_4_ = (uint)(bVar17 >> 5 & 1) * auVar38._52_4_;
              auVar59._56_4_ = (uint)(bVar17 >> 6 & 1) * auVar38._56_4_;
              auVar59._60_4_ = (uint)(bVar17 >> 7) * auVar38._60_4_;
              auVar38 = vpmulld_avx512f(auVar59,auVar39);
              uVar20 = uVar20 + 0x10;
            } while ((uVar26 + 0xf & 0x1fffffff0) != uVar20);
            auVar37 = vmovdqa32_avx512f(auVar38);
            auVar60._0_4_ =
                 (uint)(bVar16 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar39._0_4_;
            bVar13 = (bool)((byte)(uVar31 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar13 * auVar37._4_4_ | (uint)!bVar13 * auVar39._4_4_;
            bVar13 = (bool)((byte)(uVar31 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar13 * auVar37._8_4_ | (uint)!bVar13 * auVar39._8_4_;
            bVar13 = (bool)((byte)(uVar31 >> 3) & 1);
            auVar60._12_4_ = (uint)bVar13 * auVar37._12_4_ | (uint)!bVar13 * auVar39._12_4_;
            bVar13 = (bool)((byte)(uVar31 >> 4) & 1);
            auVar60._16_4_ = (uint)bVar13 * auVar37._16_4_ | (uint)!bVar13 * auVar39._16_4_;
            bVar13 = (bool)((byte)(uVar31 >> 5) & 1);
            auVar60._20_4_ = (uint)bVar13 * auVar37._20_4_ | (uint)!bVar13 * auVar39._20_4_;
            bVar13 = (bool)((byte)(uVar31 >> 6) & 1);
            auVar60._24_4_ = (uint)bVar13 * auVar37._24_4_ | (uint)!bVar13 * auVar39._24_4_;
            bVar13 = (bool)((byte)(uVar31 >> 7) & 1);
            auVar60._28_4_ = (uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * auVar39._28_4_;
            auVar60._32_4_ =
                 (uint)(bVar17 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar17 & 1) * auVar39._32_4_;
            bVar13 = (bool)(bVar17 >> 1 & 1);
            auVar60._36_4_ = (uint)bVar13 * auVar37._36_4_ | (uint)!bVar13 * auVar39._36_4_;
            bVar13 = (bool)(bVar17 >> 2 & 1);
            auVar60._40_4_ = (uint)bVar13 * auVar37._40_4_ | (uint)!bVar13 * auVar39._40_4_;
            bVar13 = (bool)(bVar17 >> 3 & 1);
            auVar60._44_4_ = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * auVar39._44_4_;
            bVar13 = (bool)(bVar17 >> 4 & 1);
            auVar60._48_4_ = (uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * auVar39._48_4_;
            bVar13 = (bool)(bVar17 >> 5 & 1);
            auVar60._52_4_ = (uint)bVar13 * auVar37._52_4_ | (uint)!bVar13 * auVar39._52_4_;
            bVar13 = (bool)(bVar17 >> 6 & 1);
            auVar60._56_4_ = (uint)bVar13 * auVar37._56_4_ | (uint)!bVar13 * auVar39._56_4_;
            auVar60._60_4_ =
                 (uint)(bVar17 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar17 >> 7) * auVar39._60_4_;
            auVar33 = vextracti64x4_avx512f(auVar60,1);
            auVar37 = vpmulld_avx512f(auVar60,ZEXT3264(auVar33));
            auVar65 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
            auVar32 = vpshufd_avx(auVar65,0xee);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            auVar32 = vpshufd_avx(auVar65,0x55);
            auVar65 = vpmulld_avx(auVar65,auVar32);
            iVar62 = auVar65._0_4_;
          }
          uVar24 = iVar62 * pTVar10[uVar27].d.bd;
          uVar26 = (ulong)uVar24;
          if (uVar24 != uVar22) goto LAB_0022a6e3;
          pfVar6 = pTVar10[uVar27].v;
          uVar27 = uVar26;
          if ((((ulong)pfVar6 & 3) == 0) &&
             (uVar27 = (ulong)(-((uint)((ulong)pfVar6 >> 2) & 0x3fffffff) & 0xf), uVar26 <= uVar27))
          {
            uVar27 = uVar26;
          }
          uVar25 = uVar26 - uVar27;
          uVar20 = uVar25 + 0xf;
          if (-1 < (long)uVar25) {
            uVar20 = uVar25;
          }
          if (uVar27 != 0) {
            uVar21 = 0;
            do {
              auVar65 = vfnmadd213ss_fma(ZEXT416((uint)pfVar5[uVar21]),ZEXT416((uint)rVar1),
                                         ZEXT416(*(uint *)(lVar12 + uVar21 * 4)));
              pfVar6[uVar21] = auVar65._0_4_ + pfVar6[uVar21];
              uVar21 = uVar21 + 1;
            } while (uVar27 != uVar21);
          }
          uVar20 = (uVar20 & 0xfffffffffffffff0) + uVar27;
          if (0xf < (long)uVar25) {
            auVar65._0_4_ = -rVar1;
            auVar65._4_4_ = 0x80000000;
            auVar65._8_4_ = 0x80000000;
            auVar65._12_4_ = 0x80000000;
            auVar37 = vbroadcastss_avx512f(auVar65);
            do {
              auVar38 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar6 + uVar27),
                                       *(undefined1 (*) [64])(lVar12 + uVar27 * 4));
              auVar38 = vfmadd231ps_avx512f(auVar38,auVar37,*(undefined1 (*) [64])(pfVar5 + uVar27))
              ;
              *(undefined1 (*) [64])(pfVar6 + uVar27) = auVar38;
              uVar27 = uVar27 + 0x10;
            } while ((long)uVar27 < (long)uVar20);
          }
          if ((long)uVar20 < (long)uVar26) {
            do {
              auVar65 = vfnmadd213ss_fma(ZEXT416((uint)pfVar5[uVar20]),ZEXT416((uint)rVar1),
                                         ZEXT416(*(uint *)(lVar12 + uVar20 * 4)));
              pfVar6[uVar20] = auVar65._0_4_ + pfVar6[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar26 != uVar20);
          }
          p_Var18 = p_Var18->_M_nxt;
        } while (p_Var18 != (_Hash_node_base *)0x0);
      }
      local_90 = (ulong)((int)local_90 + 1);
      LookupParameters::clear(this_01);
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar34 = vpbroadcastd_avx512f(ZEXT416(1));
      ppLVar19 = ppLVar19 + 1;
    } while (ppLVar19 != ppLVar8);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_0022a727:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>]"
  ;
  goto LAB_0022a753;
LAB_0022a73e:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
  ;
LAB_0022a753:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void MomentumSGDTrainer::update(real scale) {
  // executed on the first iteration to create vectors to
  // store the velocity
  if (!velocity_allocated) {
    vp = AllocateShadowParameters(*model);
    vlp = AllocateShadowLookupParameters(*model);
    velocity_allocated = true;
  }

  const float gscale = clip_gradients();
  unsigned pi = 0;
  for (auto p : model->parameters_list()) {
    Tensor& v = vp[pi++].h;
    auto reg = p->values.vec() * lambda;
    v.vec() = momentum * v.vec() - (eta * scale * gscale) * (p->g.vec());
    p->values.vec() += v.vec() - reg;
    p->clear();
  }
  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vx = vlp[pi++].h;
    for (auto i : p->non_zero_grads) {
      Tensor& v = vx[i];
      auto reg = (p->values[i].vec()) * lambda;
      v.vec() = momentum * v.vec() - (eta * scale * gscale) * (p->grads[i].vec());
      p->values[i].vec() += v.vec() - reg;
    }
    p->clear();
  }
  ++updates;
}